

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

char * __thiscall pybind11::cpp_function::strdup_guard::operator()(strdup_guard *this,char *s)

{
  value_type *__x;
  vector<char_*,_std::allocator<char_*>_> *in_RSI;
  char *t;
  
  __x = (value_type *)strdup((char *)in_RSI);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(in_RSI,__x);
  return (char *)__x;
}

Assistant:

char *operator()(const char *s) {
            auto t = strdup(s);
            strings.push_back(t);
            return t;
        }